

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
                 *this,GetterXsYs<unsigned_int> *getter1,GetterXsYs<unsigned_int> *getter2,
                TransformerLinLin *transformer,ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  ImVec2 IVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ImPlotContext *pIVar7;
  int iVar8;
  long lVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar8 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar8 = iVar2;
  }
  this->Prims = iVar8 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar7 = GImPlot;
  auVar6 = _DAT_0036a320;
  (this->P12).y = 0.0;
  lVar9 = (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride;
  iVar2 = transformer->YAxis;
  auVar11._4_4_ = 0;
  auVar11._0_4_ = *(uint *)((long)getter1->Xs + lVar9);
  auVar11._8_4_ = *(uint *)((long)getter1->Ys + lVar9);
  auVar11._12_4_ = 0;
  dVar4 = (double)DAT_0036a320;
  dVar5 = DAT_0036a320._8_8_;
  IVar1 = GImPlot->PixelRange[iVar2].Min;
  IVar10.x = (float)(GImPlot->Mx *
                     ((SUB168(auVar11 | _DAT_0036a320,0) - dVar4) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  IVar10.y = (float)(GImPlot->My[iVar2] *
                     ((SUB168(auVar11 | _DAT_0036a320,8) - dVar5) -
                     GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y);
  this->P11 = IVar10;
  iVar2 = getter2->Count;
  lVar9 = (long)((getter2->Offset % iVar2 + iVar2) % iVar2) * (long)getter2->Stride;
  iVar2 = transformer->YAxis;
  auVar12._4_4_ = 0;
  auVar12._0_4_ = *(uint *)((long)getter2->Xs + lVar9);
  auVar12._8_4_ = *(uint *)((long)getter2->Ys + lVar9);
  auVar12._12_4_ = 0;
  IVar1 = pIVar7->PixelRange[iVar2].Min;
  IVar3.y = (float)(pIVar7->My[iVar2] *
                    ((SUB168(auVar12 | auVar6,8) - dVar5) -
                    pIVar7->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y);
  IVar3.x = (float)(pIVar7->Mx *
                    ((SUB168(auVar12 | auVar6,0) - dVar4) - (pIVar7->CurrentPlot->XAxis).Range.Min)
                   + (double)IVar1.x);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }